

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O0

bool __thiscall trieste::detail::Make::try_pop(Make *this,Token *type)

{
  bool bVar1;
  element_type *this_00;
  enable_shared_from_this<trieste::NodeDef> local_30;
  Token *local_20;
  Token *type_local;
  Make *this_local;
  
  local_20 = type;
  type_local = (Token *)this;
  bVar1 = in(this,type);
  if (bVar1) {
    extend(this);
    this_00 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->node);
    NodeDef::parent(this_00);
    std::enable_shared_from_this<trieste::NodeDef>::shared_from_this(&local_30);
    std::shared_ptr<trieste::NodeDef>::operator=
              (&this->node,(shared_ptr<trieste::NodeDef> *)&local_30);
    std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)&local_30);
  }
  return bVar1;
}

Assistant:

bool try_pop(const Token& type)
      {
        if (in(type))
        {
          extend();

          node = node->parent()->shared_from_this();
          return true;
        }

        return false;
      }